

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O0

int amqp_put_back_frame(amqp_connection_state_t state,amqp_frame_t *frame)

{
  long lVar1;
  amqp_link_t *paVar2;
  amqp_frame_t *in_RDI;
  amqp_link_t *link;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar3;
  
  paVar2 = amqp_create_link_for_frame
                     ((amqp_connection_state_t)
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
  if (paVar2 == (amqp_link_t *)0x0) {
    iVar3 = -1;
  }
  else {
    lVar1._0_1_ = in_RDI[5].frame_type;
    lVar1._1_1_ = in_RDI[5].field_0x1;
    lVar1._2_2_ = in_RDI[5].channel;
    lVar1._4_4_ = *(undefined4 *)&in_RDI[5].field_0x4;
    if (lVar1 == 0) {
      *(amqp_link_t **)(in_RDI + 5) = paVar2;
      *(amqp_link_t **)&in_RDI[5].payload = paVar2;
      paVar2->next = (amqp_link_t_ *)0x0;
    }
    else {
      paVar2->next = *(amqp_link_t_ **)(in_RDI + 5);
      *(amqp_link_t **)(in_RDI + 5) = paVar2;
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int amqp_put_back_frame(amqp_connection_state_t state, amqp_frame_t *frame)
{
  amqp_link_t *link = amqp_create_link_for_frame(state, frame);
  if (NULL == link) {
    return AMQP_STATUS_NO_MEMORY;
  }

  if (NULL == state->first_queued_frame) {
    state->first_queued_frame = link;
    state->last_queued_frame = link;
    link->next = NULL;
  } else {
    link->next = state->first_queued_frame;
    state->first_queued_frame = link;
  }

  return AMQP_STATUS_OK;
}